

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O2

void __thiscall sf::priv::ClipboardImpl::ClipboardImpl(ClipboardImpl *this)

{
  Display *pDVar1;
  Atom AVar2;
  Window WVar3;
  allocator<char> local_39;
  string local_38;
  
  this->m_window = 0;
  String::String(&this->m_clipboardContents);
  std::_Deque_base<_XEvent,_std::allocator<_XEvent>_>::_Deque_base
            (&(this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>);
  this->m_requestResponded = false;
  pDVar1 = OpenDisplay();
  this->m_display = pDVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"CLIPBOARD",&local_39);
  AVar2 = getAtom(&local_38,false);
  this->m_clipboard = AVar2;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TARGETS",&local_39);
  AVar2 = getAtom(&local_38,false);
  this->m_targets = AVar2;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TEXT",&local_39);
  AVar2 = getAtom(&local_38,false);
  this->m_text = AVar2;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"UTF8_STRING",&local_39);
  AVar2 = getAtom(&local_38,true);
  this->m_utf8String = AVar2;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SFML_CLIPBOARD_TARGET_PROPERTY",&local_39);
  AVar2 = getAtom(&local_38,false);
  this->m_targetProperty = AVar2;
  std::__cxx11::string::~string((string *)&local_38);
  pDVar1 = this->m_display;
  WVar3 = XCreateSimpleWindow(pDVar1,*(undefined8 *)
                                      (*(long *)(pDVar1 + 0xe8) + 0x10 +
                                      (long)*(int *)(pDVar1 + 0xe0) * 0x80),0,0,1,1,0,0,0);
  this->m_window = WVar3;
  XSelectInput(this->m_display,WVar3,0x1f);
  return;
}

Assistant:

ClipboardImpl::ClipboardImpl() :
m_window (0),
m_requestResponded(false)
{
    // Open a connection with the X server
    m_display = OpenDisplay();

    // Get the atoms we need to make use of the clipboard
    m_clipboard      = getAtom("CLIPBOARD",                      false);
    m_targets        = getAtom("TARGETS",                        false);
    m_text           = getAtom("TEXT",                           false);
    m_utf8String     = getAtom("UTF8_STRING",                    true );
    m_targetProperty = getAtom("SFML_CLIPBOARD_TARGET_PROPERTY", false);

    // Create a hidden window that will broker our clipboard interactions with X
    m_window = XCreateSimpleWindow(m_display, DefaultRootWindow(m_display), 0, 0, 1, 1, 0, 0, 0);

    // Register the events we are interested in
    XSelectInput(m_display, m_window, SelectionNotify | SelectionClear | SelectionRequest);
}